

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orderedCollection.c
# Opt level: O3

void sysbvm_orderedCollection_add
               (sysbvm_context_t *context,sysbvm_tuple_t orderedCollection,sysbvm_tuple_t element)

{
  ulong uVar1;
  long lVar2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  sysbvm_orderedCollection_t *orderedCollectionObject;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  
  if ((orderedCollection & 0xf) != 0 || orderedCollection == 0) {
    return;
  }
  uVar4 = *(ulong *)(orderedCollection + 0x10);
  bVar8 = (uVar4 & 0xf) == 0;
  uVar6 = (long)uVar4 >> 4;
  uVar7 = uVar6;
  if (uVar4 != 0 && bVar8) {
    uVar7 = *(ulong *)(uVar4 + 0x10);
  }
  uVar1 = *(ulong *)(orderedCollection + 0x18);
  bVar9 = (uVar1 & 0xf) != 0;
  if (bVar9 || uVar1 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  if (uVar7 < uVar5) {
    *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar7 * 8) = element;
  }
  else {
    if (uVar4 != 0 && bVar8) {
      uVar6 = *(ulong *)(uVar4 + 0x10);
    }
    if (bVar9 || uVar1 == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)(*(uint *)(uVar1 + 0xc) >> 2 & 0xfffffffe);
    }
    sVar3 = 4;
    if (4 < uVar4) {
      sVar3 = uVar4;
    }
    if (*(sysbvm_tuple_t *)orderedCollection == (context->roots).weakOrderedCollectionType) {
      sVar3 = sysbvm_weakArray_create(context,sVar3);
    }
    else {
      sVar3 = sysbvm_array_create(context,sVar3);
    }
    if (uVar6 != 0) {
      lVar2 = *(long *)(orderedCollection + 0x18);
      uVar4 = 0;
      do {
        *(undefined8 *)(sVar3 + 0x10 + uVar4 * 8) = *(undefined8 *)(lVar2 + 0x10 + uVar4 * 8);
        uVar4 = uVar4 + 1;
      } while (uVar6 != uVar4);
    }
    *(sysbvm_tuple_t *)(orderedCollection + 0x18) = sVar3;
    *(sysbvm_tuple_t *)(sVar3 + 0x10 + uVar7 * 8) = element;
    if (uVar7 + 0x800000000000001 >> 0x3c != 0) {
      uVar4 = sysbvm_tuple_uint64_encodeBig(context,uVar7 + 1);
      goto LAB_0012d6cc;
    }
  }
  uVar4 = (uVar7 + 1) * 0x10 | 0xb;
LAB_0012d6cc:
  *(ulong *)(orderedCollection + 0x10) = uVar4;
  return;
}

Assistant:

SYSBVM_API void sysbvm_orderedCollection_add(sysbvm_context_t *context, sysbvm_tuple_t orderedCollection, sysbvm_tuple_t element)
{
    if(!sysbvm_tuple_isNonNullPointer(orderedCollection))
        return;

    sysbvm_orderedCollection_t *orderedCollectionObject = (sysbvm_orderedCollection_t*)orderedCollection;
    size_t size = sysbvm_tuple_size_decode(orderedCollectionObject->size);
    size_t capacity = sysbvm_tuple_getSizeInSlots(orderedCollectionObject->storage);
    if(size >= capacity)
        sysbvm_orderedCollection_increaseCapacity(context, orderedCollection);

    sysbvm_array_t *storage = (sysbvm_array_t*)orderedCollectionObject->storage;
    storage->elements[size] = element;
    orderedCollectionObject->size = sysbvm_tuple_size_encode(context, size + 1);
}